

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileTargetGenerator::WriteObjectsVariable
          (cmMakefileTargetGenerator *this,string *variableName,string *variableNameExternal,
          bool useWatcomQuote)

{
  cmLocalUnixMakefileGenerator3 *pcVar1;
  cmMakefile *this_00;
  pointer pbVar2;
  cmGeneratedFileStream *pcVar3;
  string *psVar4;
  ostream *poVar5;
  char *pcVar6;
  string *obj;
  pointer pbVar7;
  char *pcVar8;
  string currentBinDir;
  string object;
  allocator<char> local_99;
  string local_98;
  string *local_78;
  string local_70;
  string local_50;
  
  pcVar1 = this->LocalGenerator;
  local_78 = variableNameExternal;
  psVar4 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"_OBJECTS",(allocator<char> *)&local_70);
  cmLocalUnixMakefileGenerator3::CreateMakeVariable(&local_50,pcVar1,psVar4,&local_98);
  std::__cxx11::string::operator=((string *)variableName,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_98);
  poVar5 = std::operator<<((ostream *)this->BuildFileStream,"# Object files for target ");
  psVar4 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  poVar5 = std::operator<<(poVar5,(string *)psVar4);
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,(string *)variableName);
  std::operator<<(poVar5," =");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"CMAKE_MAKE_LINE_CONTINUE",(allocator<char> *)&local_70);
  pcVar6 = cmMakefile::GetDefinition(this_00,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  pcVar8 = "\\";
  if (pcVar6 != (char *)0x0) {
    pcVar8 = pcVar6;
  }
  pbVar2 = (this->Objects).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar7 = (this->Objects).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar2; pbVar7 = pbVar7 + 1) {
    poVar5 = std::operator<<((ostream *)this->BuildFileStream," ");
    poVar5 = std::operator<<(poVar5,pcVar8);
    std::operator<<(poVar5,"\n");
    pcVar3 = this->BuildFileStream;
    cmLocalUnixMakefileGenerator3::ConvertToQuotedOutputPath(&local_98,pbVar7,useWatcomQuote);
    std::operator<<((ostream *)pcVar3,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  std::operator<<((ostream *)this->BuildFileStream,"\n");
  pcVar1 = this->LocalGenerator;
  psVar4 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"_EXTERNAL_OBJECTS",&local_99);
  cmLocalUnixMakefileGenerator3::CreateMakeVariable(&local_98,pcVar1,psVar4,&local_70);
  std::__cxx11::string::operator=((string *)local_78,(string *)&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_70);
  poVar5 = std::operator<<((ostream *)this->BuildFileStream,"\n");
  poVar5 = std::operator<<(poVar5,"# External object files for target ");
  psVar4 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  poVar5 = std::operator<<(poVar5,(string *)psVar4);
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,(string *)local_78);
  std::operator<<(poVar5," =");
  psVar4 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                     ((cmLocalGenerator *)this->LocalGenerator);
  std::__cxx11::string::string((string *)&local_98,(string *)psVar4);
  pbVar2 = (this->ExternalObjects).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar7 = (this->ExternalObjects).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar2; pbVar7 = pbVar7 + 1) {
    cmLocalGenerator::MaybeConvertToRelativePath
              (&local_70,(cmLocalGenerator *)this->LocalGenerator,&local_98,pbVar7);
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    poVar5 = std::operator<<((ostream *)this->BuildFileStream," ");
    poVar5 = std::operator<<(poVar5,pcVar8);
    std::operator<<(poVar5,"\n");
    pcVar3 = this->BuildFileStream;
    cmLocalUnixMakefileGenerator3::ConvertToQuotedOutputPath(&local_70,pbVar7,useWatcomQuote);
    std::operator<<((ostream *)pcVar3,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  poVar5 = std::operator<<((ostream *)this->BuildFileStream,"\n");
  std::operator<<(poVar5,"\n");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteObjectsVariable(
  std::string& variableName, std::string& variableNameExternal,
  bool useWatcomQuote)
{
  // Write a make variable assignment that lists all objects for the
  // target.
  variableName = this->LocalGenerator->CreateMakeVariable(
    this->GeneratorTarget->GetName(), "_OBJECTS");
  *this->BuildFileStream << "# Object files for target "
                         << this->GeneratorTarget->GetName() << "\n"
                         << variableName << " =";
  std::string object;
  const char* lineContinue =
    this->Makefile->GetDefinition("CMAKE_MAKE_LINE_CONTINUE");
  if (!lineContinue) {
    lineContinue = "\\";
  }
  for (std::string const& obj : this->Objects) {
    *this->BuildFileStream << " " << lineContinue << "\n";
    *this->BuildFileStream
      << cmLocalUnixMakefileGenerator3::ConvertToQuotedOutputPath(
           obj, useWatcomQuote);
  }
  *this->BuildFileStream << "\n";

  // Write a make variable assignment that lists all external objects
  // for the target.
  variableNameExternal = this->LocalGenerator->CreateMakeVariable(
    this->GeneratorTarget->GetName(), "_EXTERNAL_OBJECTS");
  /* clang-format off */
  *this->BuildFileStream
    << "\n"
    << "# External object files for target "
    << this->GeneratorTarget->GetName() << "\n"
    << variableNameExternal << " =";
  /* clang-format on */
  std::string currentBinDir =
    this->LocalGenerator->GetCurrentBinaryDirectory();
  for (std::string const& obj : this->ExternalObjects) {
    object =
      this->LocalGenerator->MaybeConvertToRelativePath(currentBinDir, obj);
    *this->BuildFileStream << " " << lineContinue << "\n";
    *this->BuildFileStream
      << cmLocalUnixMakefileGenerator3::ConvertToQuotedOutputPath(
           obj, useWatcomQuote);
  }
  *this->BuildFileStream << "\n"
                         << "\n";
}